

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

bool opts::Options::dashed_non_option(char *arg,IsShort *is_short)

{
  bool bVar1;
  int iVar2;
  function<bool_(char)> *in_RSI;
  char *in_RDI;
  char in_stack_ffffffffffffffdf;
  byte local_11;
  
  local_11 = 0;
  if (*in_RDI == '-') {
    iVar2 = isdigit((int)in_RDI[1]);
    if ((iVar2 != 0) || (local_11 = 0, in_RDI[1] == '.')) {
      bVar1 = Catch::clara::std::function<bool_(char)>::operator()(in_RSI,in_stack_ffffffffffffffdf)
      ;
      local_11 = bVar1 ^ 0xff;
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

static bool     dashed_non_option(char* arg, BasicOption::IsShort is_short)
    {
        return arg[ 0 ] == '-'
                && (std::isdigit(arg[ 1 ]) || arg[ 1 ] == '.')
                && !is_short(arg[ 1 ]);
    }